

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int get_search_init_depth
              (int mi_width,int mi_height,int is_inter,SPEED_FEATURES *sf,int tx_size_search_method)

{
  int iVar1;
  
  iVar1 = 2;
  if ((tx_size_search_method != 2) &&
     (((sf->tx_sf).tx_size_search_lgr_block == 0 || (mi_height < 0x11 && mi_width < 0x11)))) {
    iVar1 = *(int *)((long)&((TX_SPEED_FEATURES *)(&sf->intra_sf + 1))->
                            inter_tx_size_search_init_depth_sqr +
                    (ulong)((uint)(is_inter == 0) * 8 + (uint)(mi_height != mi_width) * 4));
  }
  return iVar1;
}

Assistant:

static int get_search_init_depth(int mi_width, int mi_height, int is_inter,
                                 const SPEED_FEATURES *sf,
                                 int tx_size_search_method) {
  if (tx_size_search_method == USE_LARGESTALL) return MAX_VARTX_DEPTH;

  if (sf->tx_sf.tx_size_search_lgr_block) {
    if (mi_width > mi_size_wide[BLOCK_64X64] ||
        mi_height > mi_size_high[BLOCK_64X64])
      return MAX_VARTX_DEPTH;
  }

  if (is_inter) {
    return (mi_height != mi_width)
               ? sf->tx_sf.inter_tx_size_search_init_depth_rect
               : sf->tx_sf.inter_tx_size_search_init_depth_sqr;
  } else {
    return (mi_height != mi_width)
               ? sf->tx_sf.intra_tx_size_search_init_depth_rect
               : sf->tx_sf.intra_tx_size_search_init_depth_sqr;
  }
}